

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

long gflags::anon_unknown_2::GetFromEnv<long>(char *varname,long dflt)

{
  bool bVar1;
  long *valbuf;
  char *value;
  undefined8 uVar2;
  undefined1 local_60 [8];
  FlagValue ifv;
  string local_40 [8];
  string valstr;
  long dflt_local;
  char *varname_local;
  
  std::__cxx11::string::string(local_40);
  bVar1 = SafeGetEnv(varname,(string *)local_40);
  varname_local = (char *)dflt;
  if (bVar1) {
    valbuf = (long *)operator_new(8);
    FlagValue::FlagValue<long>((FlagValue *)local_60,valbuf,true);
    value = (char *)std::__cxx11::string::c_str();
    bVar1 = FlagValue::ParseFrom((FlagValue *)local_60,value);
    if (!bVar1) {
      uVar2 = std::__cxx11::string::c_str();
      ReportError(DIE,"ERROR: error parsing env variable \'%s\' with value \'%s\'\n",varname,uVar2);
    }
    varname_local = *(char **)local_60;
    FlagValue::~FlagValue((FlagValue *)local_60);
  }
  std::__cxx11::string::~string(local_40);
  return (long)varname_local;
}

Assistant:

T GetFromEnv(const char *varname, T dflt) {
  std::string valstr;
  if (SafeGetEnv(varname, valstr)) {
    FlagValue ifv(new T, true);
    if (!ifv.ParseFrom(valstr.c_str())) {
      ReportError(DIE, "ERROR: error parsing env variable '%s' with value '%s'\n",
                  varname, valstr.c_str());
    }
    return OTHER_VALUE_AS(ifv, T);
  } else return dflt;
}